

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tree.cpp
# Opt level: O0

BehaviorResult __thiscall
TBT::PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>::callFunc<0>
          (PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&> *this,tuple<Arm_&> *param_2)

{
  BehaviorResult BVar1;
  pointer pBVar2;
  Arm *pAVar3;
  tuple<Arm_&> *params_local;
  PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&> *this_local;
  
  pBVar2 = std::
           unique_ptr<TBT::BehaviorNode<Arm_&>,_std::default_delete<TBT::BehaviorNode<Arm_&>_>_>::
           operator->(&this->child);
  pAVar3 = std::get<0ul,Arm&>(param_2);
  BVar1 = (**pBVar2->_vptr_BehaviorNode)(pBVar2,pAVar3);
  return BVar1;
}

Assistant:

int main()
{
    Body body;


    BehaviorTree<Body&> tree;

    auto rootNode = std::make_unique<SequenceNode<Body&>>();
    auto peelLeftArm = std::make_unique<PeelLeftArm>();
    peelLeftArm->setChild(std::make_unique<PrintArmNode>());
    rootNode->addChild(std::move(peelLeftArm));
    auto peelRightArm = std::make_unique<PeelRightArm>();
    peelRightArm->setChild(std::make_unique<PrintArmNode>());
    rootNode->addChild(std::move(peelRightArm));

    tree.setRoot(std::move(rootNode));

    tree.tickRoot(body);

    return 0;
}